

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5ExprNodeNext_STRING(Fts5Expr *pExpr,Fts5ExprNode *pNode,int bFromValid,i64 iFrom)

{
  Fts5ExprPhrase *pFVar1;
  long lVar2;
  Fts5IndexIter *pFVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  Fts5ExprTerm *pFVar8;
  Fts5ExprTerm *pFVar9;
  long lVar10;
  bool bVar11;
  
  pFVar1 = pNode->pNear->apPhrase[0];
  pNode->bNomatch = 0;
  if (pFVar1->aTerm[0].pSynonym == (Fts5ExprTerm *)0x0) {
    pFVar3 = pFVar1->aTerm[0].pIter;
    if (bFromValid == 0) {
      iVar6 = sqlite3Fts5IterNext(pFVar3);
    }
    else {
      iVar6 = sqlite3Fts5IterNextFrom(pFVar3,iFrom);
    }
    bVar11 = true;
    if (iVar6 == 0) {
      bVar11 = pFVar3->bEof != '\0';
    }
  }
  else {
    pFVar9 = pFVar1->aTerm;
    lVar10 = 0;
    bVar11 = false;
    pFVar8 = pFVar9;
    do {
      if ((pFVar8->pIter->bEof == '\0') &&
         ((lVar2 = pFVar8->pIter->iRowid, !bVar11 ||
          (bVar11 = true, pExpr->bDesc != (uint)(lVar2 < lVar10))))) {
        bVar11 = true;
        lVar10 = lVar2;
      }
      pFVar8 = pFVar8->pSynonym;
    } while (pFVar8 != (Fts5ExprTerm *)0x0);
    iVar6 = 0;
    bVar5 = true;
    do {
      pFVar3 = pFVar9->pIter;
      bVar11 = bVar5;
      if (pFVar3->bEof == '\0') {
        lVar2 = pFVar3->iRowid;
        if (lVar2 == lVar10) {
LAB_001e1819:
          if (bFromValid == 0) {
            iVar7 = sqlite3Fts5IterNext(pFVar3);
          }
          else {
            iVar7 = sqlite3Fts5IterNextFrom(pFVar3,iFrom);
          }
          iVar6 = 0;
          if (iVar7 == 0) {
            bVar11 = bVar5;
            if (pFVar9->pIter->bEof == '\0') {
              bVar11 = false;
            }
            bVar4 = true;
          }
          else {
            bVar4 = false;
            iVar6 = iVar7;
            bVar11 = bVar5;
          }
        }
        else {
          bVar11 = false;
          bVar4 = true;
          if (((bFromValid != 0) && (lVar2 != iFrom)) && (pExpr->bDesc == (uint)(iFrom < lVar2)))
          goto LAB_001e1819;
        }
        if (!bVar4) break;
      }
      pFVar9 = pFVar9->pSynonym;
      bVar5 = bVar11;
    } while (pFVar9 != (Fts5ExprTerm *)0x0);
    bVar11 = bVar11 || iVar6 != 0;
  }
  pNode->bEof = (uint)bVar11;
  if (bVar11 == false) {
    iVar6 = fts5ExprNodeTest_STRING(pExpr,pNode);
    return iVar6;
  }
  return iVar6;
}

Assistant:

static int fts5ExprNodeNext_STRING(
  Fts5Expr *pExpr,                /* Expression pPhrase belongs to */
  Fts5ExprNode *pNode,            /* FTS5_STRING or FTS5_TERM node */
  int bFromValid,
  i64 iFrom
){
  Fts5ExprTerm *pTerm = &pNode->pNear->apPhrase[0]->aTerm[0];
  int rc = SQLITE_OK;

  pNode->bNomatch = 0;
  if( pTerm->pSynonym ){
    int bEof = 1;
    Fts5ExprTerm *p;

    /* Find the firstest rowid any synonym points to. */
    i64 iRowid = fts5ExprSynonymRowid(pTerm, pExpr->bDesc, 0);

    /* Advance each iterator that currently points to iRowid. Or, if iFrom
    ** is valid - each iterator that points to a rowid before iFrom.  */
    for(p=pTerm; p; p=p->pSynonym){
      if( sqlite3Fts5IterEof(p->pIter)==0 ){
        i64 ii = p->pIter->iRowid;
        if( ii==iRowid
         || (bFromValid && ii!=iFrom && (ii>iFrom)==pExpr->bDesc)
        ){
          if( bFromValid ){
            rc = sqlite3Fts5IterNextFrom(p->pIter, iFrom);
          }else{
            rc = sqlite3Fts5IterNext(p->pIter);
          }
          if( rc!=SQLITE_OK ) break;
          if( sqlite3Fts5IterEof(p->pIter)==0 ){
            bEof = 0;
          }
        }else{
          bEof = 0;
        }
      }
    }

    /* Set the EOF flag if either all synonym iterators are at EOF or an
    ** error has occurred.  */
    pNode->bEof = (rc || bEof);
  }else{
    Fts5IndexIter *pIter = pTerm->pIter;

    assert( Fts5NodeIsString(pNode) );
    if( bFromValid ){
      rc = sqlite3Fts5IterNextFrom(pIter, iFrom);
    }else{
      rc = sqlite3Fts5IterNext(pIter);
    }

    pNode->bEof = (rc || sqlite3Fts5IterEof(pIter));
  }

  if( pNode->bEof==0 ){
    assert( rc==SQLITE_OK );
    rc = fts5ExprNodeTest_STRING(pExpr, pNode);
  }

  return rc;
}